

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O0

pair<std::optional<std::span<const_std::byte,_18446744073709551615UL>_>,_std::unique_lock<std::mutex>_>
* __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
          (pair<std::optional<std::span<const_std::byte,_18446744073709551615UL>_>,_std::unique_lock<std::mutex>_>
           *__return_storage_ptr__,
          mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  bool bVar1;
  unique_lock<std::mutex> local_60;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_50;
  undefined1 local_48 [8];
  get_result db_get_result;
  unique_lock<std::mutex> guard;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  art_key_type k_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             &db_get_result.
              super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
              _M_engaged,&this->mutex);
  local_50 = k.field_0;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
            ((get_result *)local_48,&this->db_,(art_key_type)k.field_0);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
  if (bVar1) {
    std::
    make_pair<std::optional<std::span<std::byte_const,18446744073709551615ul>>const&,std::unique_lock<std::mutex>>
              (__return_storage_ptr__,
               (optional<std::span<const_std::byte,_18446744073709551615UL>_> *)local_48,
               (unique_lock<std::mutex> *)
               &db_get_result.
                super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                _M_engaged);
  }
  else {
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               &db_get_result.
                super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
                _M_engaged);
    std::unique_lock<std::mutex>::unique_lock(&local_60);
    std::
    make_pair<std::optional<std::span<std::byte_const,18446744073709551615ul>>const&,std::unique_lock<std::mutex>>
              (__return_storage_ptr__,
               (optional<std::span<const_std::byte,_18446744073709551615UL>_> *)local_48,&local_60);
    std::unique_lock<std::mutex>::~unique_lock(&local_60);
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             &db_get_result.
              super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
              _M_engaged);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] auto get_internal(art_key_type k) const noexcept {
    std::unique_lock guard{mutex};
    const auto db_get_result{db_.get_internal(k)};
    if (!db_get_result) {
      guard.unlock();
      return std::make_pair(db_get_result, std::unique_lock<std::mutex>{});
    }
    return std::make_pair(db_get_result, std::move(guard));
  }